

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintexteditsearchwidget.cpp
# Opt level: O0

void __thiscall
QPlainTextEditSearchWidget::setReplaceMode(QPlainTextEditSearchWidget *this,bool enabled)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  bool enabled_local;
  QPlainTextEditSearchWidget *this_local;
  
  QAbstractButton::setChecked(SUB81(*(undefined8 *)(*(long *)(this + 0x28) + 0x40),0));
  (**(code **)(**(long **)(*(long *)(this + 0x28) + 0x30) + 0x68))
            (*(long **)(*(long *)(this + 0x28) + 0x30),enabled,extraout_RDX,enabled);
  (**(code **)(**(long **)(*(long *)(this + 0x28) + 0x10) + 0x68))
            (*(long **)(*(long *)(this + 0x28) + 0x10),enabled,extraout_RDX_00,enabled);
  (**(code **)(**(long **)(*(long *)(this + 0x28) + 0x58) + 0x68))
            (*(long **)(*(long *)(this + 0x28) + 0x58),enabled,extraout_RDX_01,enabled);
  (**(code **)(**(long **)(*(long *)(this + 0x28) + 0x60) + 0x68))
            (*(long **)(*(long *)(this + 0x28) + 0x60),enabled,extraout_RDX_02,enabled);
  (**(code **)(**(long **)(*(long *)(this + 0x28) + 0x50) + 0x68))
            (*(long **)(*(long *)(this + 0x28) + 0x50),enabled,extraout_RDX_03,enabled);
  return;
}

Assistant:

void QPlainTextEditSearchWidget::setReplaceMode(bool enabled) {
    ui->replaceToggleButton->setChecked(enabled);
    ui->replaceLabel->setVisible(enabled);
    ui->replaceLineEdit->setVisible(enabled);
    ui->modeLabel->setVisible(enabled);
    ui->buttonFrame->setVisible(enabled);
    ui->matchCaseSensitiveButton->setVisible(enabled);
}